

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

IssuePtr __thiscall libcellml::Logger::message(Logger *this,size_t index)

{
  long lVar1;
  const_reference pvVar2;
  __shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  IssuePtr IVar4;
  
  this->_vptr_Logger = (_func_int **)0x0;
  this->mPimpl = (LoggerImpl *)0x0;
  lVar1 = *(long *)(index + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      (*(long *)(lVar1 + 0x38) - *(long *)(lVar1 + 0x30) >> 3)) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar1 + 0x30),
                        (size_type)in_RDX._M_pi);
    p_Var3 = &std::
              vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
              ::at((vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
                    *)(lVar1 + 0x48),*pvVar2)->
              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var3);
    in_RDX._M_pi = extraout_RDX;
  }
  IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Logger::message(size_t index) const
{
    IssuePtr issue = nullptr;
    if (index < pFunc()->mMessages.size()) {
        issue = pFunc()->mIssues.at(pFunc()->mMessages.at(index));
    }
    return issue;
}